

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

logic_t __thiscall slang::SVInt::reductionXor(SVInt *this)

{
  byte bVar1;
  bitwidth_t bVar2;
  
  bVar1 = 0x80;
  if ((this->super_SVIntStorage).unknownFlag == false) {
    bVar2 = countOnes(this);
    bVar1 = (byte)bVar2 & 1;
  }
  return (logic_t)bVar1;
}

Assistant:

logic_t SVInt::reductionXor() const {
    if (unknownFlag)
        return logic_t::x;

    // reduction xor basically determines whether the number of set
    // bits in the number is even or odd
    uint32_t count = countOnes();
    if (count % 2 == 0)
        return logic_t(0);

    return logic_t(1);
}